

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_RegisterString::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  char cVar3;
  Template *pTVar4;
  Template *pTVar5;
  string expected;
  TemplateDictionary dict;
  TemplateString local_78;
  TemplateString local_58;
  TemplateString local_38;
  
  ctemplate::TemplateString::TemplateString((TemplateString *)&dict,"file1");
  ctemplate::TemplateString::TemplateString((TemplateString *)&expected,"Some text");
  cVar3 = ctemplate::Template::StringToTemplateCache
                    ((TemplateString *)&dict,(TemplateString *)&expected);
  if (cVar3 == '\0') {
    printf("ASSERT FAILED, line %d: %s\n",0x830,
           "Template::StringToTemplateCache(\"file1\", \"Some text\")");
    ctemplate::TemplateString::TemplateString((TemplateString *)&dict,"file1");
    ctemplate::TemplateString::TemplateString((TemplateString *)&expected,"Some text");
    cVar3 = ctemplate::Template::StringToTemplateCache
                      ((TemplateString *)&dict,(TemplateString *)&expected);
    if (cVar3 == '\0') {
      __assert_fail("Template::StringToTemplateCache(\"file1\", \"Some text\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x830,"static void Test_Template_RegisterString::Run()");
    }
  }
  else {
    ctemplate::TemplateString::TemplateString((TemplateString *)&dict,"file1");
    pTVar4 = (Template *)ctemplate::Template::GetTemplate((TemplateString *)&dict,STRIP_WHITESPACE);
    if (pTVar4 == (Template *)0x0) {
      printf("ASSERT FAILED, line %d: %s\n",0x832,"tpl");
      __assert_fail("tpl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x832,"static void Test_Template_RegisterString::Run()");
    }
    ctemplate::TemplateString::TemplateString((TemplateString *)&dict,"file1");
    pTVar5 = (Template *)ctemplate::Template::GetTemplate((TemplateString *)&dict,STRIP_WHITESPACE);
    if (pTVar5 == pTVar4) {
      ctemplate::TemplateString::TemplateString((TemplateString *)&dict,"file2");
      ctemplate::TemplateString::TemplateString((TemplateString *)&expected,"Top {{>INC}}");
      cVar3 = ctemplate::Template::StringToTemplateCache
                        ((TemplateString *)&dict,(TemplateString *)&expected);
      if (cVar3 != '\0') {
        ctemplate::TemplateString::TemplateString((TemplateString *)&expected,"dict");
        ctemplate::TemplateDictionary::TemplateDictionary
                  (&dict,(TemplateString *)&expected,(UnsafeArena *)0x0);
        std::__cxx11::string::string((string *)&expected,"Some text",(allocator *)&local_78);
        ctemplate::AssertExpandIs(pTVar4,&dict,&expected,true);
        ctemplate::TemplateString::TemplateString(&local_38,"INC");
        TVar1.length_ = local_38.length_;
        TVar1.ptr_ = local_38.ptr_;
        TVar1.is_immutable_ = local_38.is_immutable_;
        TVar1._17_7_ = local_38._17_7_;
        TVar1.id_ = local_38.id_;
        ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
        ctemplate::TemplateString::TemplateString(&local_58,"file1");
        TVar2.length_ = local_58.length_;
        TVar2.ptr_ = local_58.ptr_;
        TVar2.is_immutable_ = local_58.is_immutable_;
        TVar2._17_7_ = local_58._17_7_;
        TVar2.id_ = local_58.id_;
        ctemplate::TemplateDictionary::SetFilename(TVar2);
        ctemplate::TemplateString::TemplateString(&local_78,"file2");
        pTVar4 = (Template *)ctemplate::Template::GetTemplate(&local_78,STRIP_WHITESPACE);
        std::__cxx11::string::assign((char *)&expected);
        ctemplate::AssertExpandIs(pTVar4,&dict,&expected,true);
        std::__cxx11::string::~string((string *)&expected);
        ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
        return;
      }
      printf("ASSERT FAILED, line %d: %s\n",0x835,
             "Template::StringToTemplateCache(\"file2\", \"Top {{>INC}}\")");
      ctemplate::TemplateString::TemplateString((TemplateString *)&dict,"file2");
      ctemplate::TemplateString::TemplateString((TemplateString *)&expected,"Top {{>INC}}");
      cVar3 = ctemplate::Template::StringToTemplateCache
                        ((TemplateString *)&dict,(TemplateString *)&expected);
      if (cVar3 == '\0') {
        __assert_fail("Template::StringToTemplateCache(\"file2\", \"Top {{>INC}}\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x835,"static void Test_Template_RegisterString::Run()");
      }
    }
    else {
      printf("ASSERT FAILED, line %d: %s\n",0x833,
             "Template::GetTemplate(\"file1\", STRIP_WHITESPACE) == tpl");
      ctemplate::TemplateString::TemplateString((TemplateString *)&dict,"file1");
      pTVar5 = (Template *)
               ctemplate::Template::GetTemplate((TemplateString *)&dict,STRIP_WHITESPACE);
      if (pTVar5 != pTVar4) {
        __assert_fail("Template::GetTemplate(\"file1\", STRIP_WHITESPACE) == tpl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x833,"static void Test_Template_RegisterString::Run()");
      }
    }
  }
  exit(1);
}

Assistant:

TEST(Template, RegisterString) {
  ASSERT(Template::StringToTemplateCache("file1", "Some text"));
  Template* tpl = Template::GetTemplate("file1", STRIP_WHITESPACE);
  ASSERT(tpl);
  ASSERT(Template::GetTemplate("file1", STRIP_WHITESPACE) == tpl);

  ASSERT(Template::StringToTemplateCache("file2", "Top {{>INC}}"));

  TemplateDictionary dict("dict");
  string expected = "Some text";
  AssertExpandIs(tpl, &dict, expected, true);

  TemplateDictionary* sub_dict = dict.AddIncludeDictionary("INC");
  sub_dict->SetFilename("file1");
  tpl = Template::GetTemplate("file2", STRIP_WHITESPACE);
  expected = "Top Some text";
  AssertExpandIs(tpl, &dict, expected, true);
}